

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.c
# Opt level: O1

int curious_register_callback
              (curious_t curious_inst,curious_callback_type_t type,curious_callback_f callback,
              void *usr_args)

{
  curious_callback_data_t data;
  curious_callback_f local_18;
  void *local_10;
  curious_t local_8;
  
  if (5U >= (uint)type) {
    local_18 = callback;
    local_10 = usr_args;
    local_8 = curious_inst;
    append_to_curious_dynamic_array(callback_registry + (uint)type,&local_18);
  }
  return (uint)(5U < (uint)type);
}

Assistant:

int curious_register_callback(
    curious_t               curious_inst,
    curious_callback_type_t type,
    curious_callback_f      callback,
    void*                   usr_args
)
{
    if (0 <= type && type < CURIOUS_CALLBACK_TYPE_COUNT) {
        //we don't need to allocate space to hold the data, since it's just going to be memcpy-ed into an array
        curious_callback_data_t data;

        //initialise feilds
        data.callback     = callback;
        data.usr_args     = usr_args;
        data.curious_inst = curious_inst;

        //add record to the part of the registry corresponding to its type
        append_to_curious_dynamic_array(callback_registry + type, (void*) &data);

        return 0;
    } else {
        return CURIOUS_ERR_INVALID_CALLBACK_TYPE;
    }
}